

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O2

chunk_conflict * desert_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  int iVar1;
  int iVar2;
  short sVar3;
  short sVar4;
  _Bool _Var5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  int iVar9;
  chunk *c;
  feature *pfVar10;
  wchar_t *pwVar11;
  loc_conflict lVar12;
  int iVar13;
  int iVar14;
  char **ppcVar15;
  ulong uVar16;
  wchar_t wVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  loc lVar23;
  bool bVar24;
  ulong local_90;
  int local_84;
  long local_80;
  int local_70;
  loc_conflict local_60;
  wchar_t form_feats [7];
  
  wVar17 = (wchar_t)p->place;
  sVar3 = p->last_place;
  sVar4 = p->depth;
  form_feats[0] = FEAT_GRASS;
  form_feats[1] = FEAT_PASS_RUBBLE;
  form_feats[2] = FEAT_MAGMA;
  form_feats[3] = FEAT_GRANITE;
  form_feats[4] = FEAT_DUNE;
  form_feats[5] = FEAT_QUARTZ;
  form_feats[6] = FEAT_NONE;
  lVar22 = 0;
  ppcVar15 = p_error;
  local_60 = loc(0,0);
  local_90 = (ulong)local_60 >> 0x20;
  c = (chunk *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  c->depth = (int)p->depth;
  c->place = wVar17;
  for (lVar21 = 0; lVar21 < c->height; lVar21 = lVar21 + 1) {
    for (lVar20 = 0; lVar20 < c->width; lVar20 = lVar20 + 1) {
      square_set_feat((chunk_conflict *)c,(loc)(lVar22 + lVar20),FEAT_GRASS);
    }
    lVar22 = lVar22 + 0x100000000;
  }
  local_84 = sVar4 * 0x14;
  alloc_paths((chunk_conflict *)c,(player *)(ulong)(uint)wVar17,(int)sVar3,(wchar_t)ppcVar15);
  set_num_vaults((chunk_conflict *)c);
  make_edges((chunk_conflict *)c,true,false);
  if (world->levels[wVar17].down != (char *)0x0) {
    num_wild_vaults = L'\0';
    local_80 = 0;
    for (uVar16 = 0; wVar17 = c->width, (long)uVar16 < (long)wVar17; uVar16 = uVar16 + 1) {
      uVar18 = uVar16 & 0xffffffff;
      lVar21 = 0;
      for (lVar22 = 0; local_80 != lVar22; lVar22 = lVar22 + -1) {
        lVar23 = (loc)(lVar21 + uVar18);
        _Var5 = square_in_bounds_fully((chunk_conflict *)c,lVar23);
        if (_Var5) {
          pfVar10 = square_feat((chunk_conflict *)c,lVar23);
          if (pfVar10->fidx == FEAT_ROAD) {
            local_60 = (loc_conflict)(lVar22 - local_80);
            local_90 = -lVar22;
            square_set_feat((chunk_conflict *)c,(loc)(lVar21 + uVar18),FEAT_MORE);
            wVar17 = level_topography((int)sVar3);
            if ((wVar17 == L'\a') || (turn < 10)) {
              player_place((chunk_conflict2 *)c,p,(loc)(lVar21 + uVar18));
            }
            break;
          }
          square_set_feat((chunk_conflict *)c,lVar23,FEAT_GRANITE);
        }
        lVar21 = lVar21 + 0x100000000;
        uVar18 = (ulong)((int)uVar18 - 1);
      }
      if ((int)local_90 != 0) {
        wVar17 = c->width;
        break;
      }
      local_80 = local_80 + -1;
      local_90 = 0;
    }
    iVar13 = wVar17 * c->height;
    local_84 = (int)((iVar13 - ((uint)((int)uVar16 * (int)uVar16) >> 1)) * local_84) / iVar13;
  }
  lVar22 = 0;
  for (lVar21 = 0; lVar21 < c->height; lVar21 = lVar21 + 1) {
    for (lVar20 = 0; lVar20 < c->width; lVar20 = lVar20 + 1) {
      lVar23 = (loc)(lVar22 + lVar20);
      pfVar10 = square_feat((chunk_conflict *)c,lVar23);
      if (pfVar10->fidx == FEAT_GRASS) {
        uVar6 = Rand_div(2);
        if (uVar6 == 0) {
          pwVar11 = &FEAT_DUNE;
        }
        else {
          uVar6 = Rand_div(2);
          if (uVar6 == 0) {
            pwVar11 = &FEAT_PASS_RUBBLE;
          }
          else {
            pwVar11 = &FEAT_MAGMA;
          }
        }
        square_set_feat((chunk_conflict *)c,lVar23,*pwVar11);
      }
      else {
        square_mark((chunk_conflict *)c,lVar23);
      }
    }
    lVar22 = lVar22 + 0x100000000;
  }
  local_70 = rand_range(2,4);
  iVar13 = 0x32;
  do {
    do {
      do {
        bVar24 = iVar13 == 0;
        iVar13 = iVar13 + -1;
        if (bVar24) goto LAB_00159443;
        uVar6 = Rand_div(6);
        iVar1 = uVar6 + 4;
        uVar7 = Rand_div(5);
        iVar2 = uVar7 + 4;
        iVar9 = 7;
        if (7 < iVar2) {
          iVar9 = iVar2;
        }
        iVar14 = (c->height - uVar7) + -5;
        iVar19 = c->height + L'\xfffffff8';
        if (iVar14 < iVar19) {
          iVar19 = iVar14;
        }
        iVar19 = rand_range(iVar9,iVar19);
        iVar9 = 10;
        if (10 < iVar1) {
          iVar9 = iVar1;
        }
        iVar8 = (c->width - uVar6) + -5;
        iVar14 = c->height + L'\xfffffff5';
        if (iVar8 < iVar14) {
          iVar14 = iVar8;
        }
        iVar9 = rand_range(iVar9,iVar14);
        lVar23 = (loc)loc(iVar9,iVar19);
        _Var5 = square_isgranite((chunk_conflict *)c,lVar23);
      } while (_Var5);
      lVar12 = loc(iVar9,iVar19);
      wVar17 = distance(lVar12,(loc_conflict)((ulong)local_60 & 0xffffffff | local_90 << 0x20));
    } while (wVar17 < iVar1 + iVar2);
    _Var5 = generate_starburst_room
                      (c,iVar19 - iVar2,iVar9 - iVar1,iVar19 + iVar2,iVar9 + iVar1,false,FEAT_GRASS,
                       false);
    local_70 = local_70 - (uint)_Var5;
  } while (local_70 != 0);
LAB_00159443:
  for (iVar13 = 0; iVar13 < local_84; iVar13 = iVar13 + wVar17) {
    uVar6 = Rand_div(c->height + L'\xfffffffe');
    uVar7 = Rand_div(c->width + L'\xfffffffe');
    lVar12.y = uVar6 + 1;
    lVar12.x = uVar7 + 1;
    wVar17 = make_formation((chunk_conflict *)c,p,lVar12,FEAT_RUBBLE,FEAT_MAGMA,form_feats,"Desert",
                            c->depth);
  }
  lVar21 = 0;
  for (lVar22 = 0; lVar22 < c->height; lVar22 = lVar22 + 1) {
    for (lVar20 = 0; lVar20 < c->width; lVar20 = lVar20 + 1) {
      square_unmark((chunk_conflict *)c,(loc)(lVar21 + lVar20));
    }
    lVar21 = lVar21 + 0x100000000;
  }
  populate((chunk_conflict *)c,false);
  _Var5 = verify_level((chunk_conflict *)c);
  if (!_Var5) {
    wipe_mon_list(c,p);
    cave_free((chunk_conflict *)c);
    *p_error = "wilderness level had generation issues";
    c = (chunk *)0x0;
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *desert_gen(struct player *p, int height, int width,
						 const char **p_error)
{
	bool made_plat;

	struct loc grid;
	int j, d = 0;
	int plats;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;
	int form_grids_target = p->depth * 20;

	int form_feats[] = { FEAT_GRASS, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_DUNE, FEAT_QUARTZ, FEAT_NONE };
	struct loc stair = loc(0, 0);

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass so paths work */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create grass */
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Dungeon entrance */
	if (world->levels[place].down) {
		/* No vaults */
		num_wild_vaults = 0;

		/* Angband! */
		for (d = 0; d < c->width; d++) {
			for (grid.y = 0; grid.y < d; grid.y++) {
				grid.x = d - grid.y;
				if (!square_in_bounds_fully(c, grid))
					continue;
				if (square_feat(c, grid)->fidx == FEAT_ROAD) {
					/* The gate of Angband */
					square_set_feat(c, grid, FEAT_MORE);
					stair = grid;
					if (level_topography(last_place) == TOP_CAVE || turn < 10)
						player_place(c, p, grid);
					break;
				} else {
					/* The walls of Thangorodrim */
					square_set_feat(c, grid, FEAT_GRANITE);
				}
			}
			if (stair.y)
				break;
		}

		/* Adjust formation grids for how much of the level is removed */
		form_grids_target *= (c->width * c->height - (d * d / 2));
		form_grids_target /= (c->width * c->height);
	}

	/* Now place rubble, sand and magma */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			/* Create desert */
			if (square_feat(c, grid)->fidx == FEAT_GRASS) {
				if (one_in_(2))
					square_set_feat(c, grid, FEAT_DUNE);
				else if (one_in_(2))
					square_set_feat(c, grid, FEAT_PASS_RUBBLE);
				else
					square_set_feat(c, grid, FEAT_MAGMA);
			} else
				/* Prepare for clearings */
				square_mark(c, grid);
		}
	}

	/* Make a few clearings */
	plats = rand_range(2, 4);

	/* Try fairly hard */
	for (j = 0; j < 50; j++) {
		int a, b, x, xlo, xhi, y, ylo, yhi;

		/*
		 * Try for a clearing.  Constrain the center choice so the
		 * bounding box is in bounds and the center won't be within
		 * the maximum possible extent of the walls created by
		 * make_edges() (that's to avoid a room that's entirely
		 * surrounded by those walls).
		 */
		a = randint0(6) + 4;
		b = randint0(5) + 4;
		ylo = MAX(b, 7);
		yhi = MIN(c->height - 1 - b, c->height - 8);
		y = rand_range(ylo, yhi);
		xlo = MAX(a, 10);
		xhi = MIN(c->width - 1 - a, c->height - 11);
		x = rand_range(xlo, xhi);
		if (square_isgranite(c, loc(x, y))) continue;
		if (distance(loc(x, y), stair) < a + b) continue;
		made_plat = generate_starburst_room(c, y - b, x - a, y + b, x + a,
											false, FEAT_GRASS, false);

		/* Success ? */
		if (made_plat)
			plats--;

		/* Done ? */
		if (!plats)
			break;
	}

	/* Place some formations */
	while (form_grids < form_grids_target) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_RUBBLE, FEAT_MAGMA,
									 form_feats, "Desert", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}